

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

void __thiscall
t_st_generator::st_setter(t_st_generator *this,ostream *out,string *cls,string *name,string *type)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)cls);
  std::operator+(&bStack_88,name,": ");
  std::operator+(&local_68,&bStack_88,type);
  st_method(this,out,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  poVar1 = std::operator<<(out,(string *)name);
  std::operator+(&bStack_88," := ",type);
  std::operator<<(poVar1,(string *)&bStack_88);
  std::__cxx11::string::~string((string *)&bStack_88);
  st_close_method(this,out);
  return;
}

Assistant:

void t_st_generator::st_setter(std::ostream& out,
                               string cls,
                               string name,
                               string type = "anObject") {
  st_method(out, cls, name + ": " + type);
  out << name << " := " + type;
  st_close_method(out);
}